

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

Status kwssys::SystemTools::GetPermissions(char *file,mode_t *mode)

{
  Status SVar1;
  allocator local_31;
  string local_30;
  
  if (file == (char *)0x0) {
    SVar1.Kind_ = POSIX;
    SVar1.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x16;
  }
  else {
    std::__cxx11::string::string((string *)&local_30,file,&local_31);
    SVar1 = GetPermissions(&local_30,mode);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return SVar1;
}

Assistant:

Status SystemTools::GetPermissions(const char* file, mode_t& mode)
{
  if (!file) {
    return Status::POSIX(EINVAL);
  }
  return SystemTools::GetPermissions(std::string(file), mode);
}